

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O1

zt_mem_set * zt_mem_set_init(char *name)

{
  zt_mem_set *pzVar1;
  char *pcVar2;
  
  pzVar1 = (zt_mem_set *)malloc(0x28);
  if (pzVar1 == (zt_mem_set *)0x0) {
    pzVar1 = (zt_mem_set *)0x0;
  }
  else {
    (pzVar1->set_list).prev = (zt_elist *)pzVar1;
    (pzVar1->set_list).next = (zt_elist *)pzVar1;
    (pzVar1->elt_list).prev = &pzVar1->elt_list;
    (pzVar1->elt_list).next = &pzVar1->elt_list;
    pcVar2 = "*unknown*";
    if (name != (char *)0x0) {
      pcVar2 = name;
    }
    pcVar2 = zt_mem_strdup(pcVar2);
    pzVar1->name = pcVar2;
  }
  return pzVar1;
}

Assistant:

zt_mem_set *
zt_mem_set_init(char *name)
{
    zt_mem_set * set;

    if ((set = GLOBAL_zmt.alloc(sizeof(zt_mem_set))) == 0) {
        return NULL;
    }

    zt_elist_reset(&set->set_list);
    zt_elist_reset(&set->elt_list);

    set->name = zt_mem_strdup(name ? name : "*unknown*");

    return set;
}